

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O2

void __thiscall tf::Taskflow::Taskflow(Taskflow *this,Taskflow *rhs)

{
  bool bVar1;
  undefined7 uVar2;
  
  (this->super_FlowBuilder)._graph = &this->_graph;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_graph).
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_graph).
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_graph).
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  queue<std::shared_ptr<tf::Topology>,std::deque<std::shared_ptr<tf::Topology>,std::allocator<std::shared_ptr<tf::Topology>>>>
  ::
  queue<std::deque<std::shared_ptr<tf::Topology>,std::allocator<std::shared_ptr<tf::Topology>>>,void>
            (&this->_topologies);
  (this->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  std::mutex::lock(&rhs->_mutex);
  std::__cxx11::string::operator=((string *)&this->_name,(string *)&rhs->_name);
  std::
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ::_M_move_assign(&(this->_graph).
                    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   ,&rhs->_graph);
  std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_move_assign1(&(this->_topologies).c,&rhs->_topologies);
  bVar1 = (rhs->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
          _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged;
  uVar2 = *(undefined7 *)
           &(rhs->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
            _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>.field_0x9;
  (this->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_payload =
       (rhs->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
       _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_payload;
  (this->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = bVar1;
  *(undefined7 *)
   &(this->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>.field_0x9 = uVar2;
  if ((rhs->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged == true
     ) {
    (rhs->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
    .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&rhs->_mutex);
  return;
}

Assistant:

inline Taskflow::Taskflow(Taskflow&& rhs) : FlowBuilder{_graph} {

  std::scoped_lock<std::mutex> lock(rhs._mutex);

  _name = std::move(rhs._name);
  _graph = std::move(rhs._graph);
  _topologies = std::move(rhs._topologies);
  _satellite = rhs._satellite;

  rhs._satellite.reset();
}